

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleRateConverter.cpp
# Opt level: O0

void __thiscall
MT32Emu::SampleRateConverter::getOutputSamples
          (SampleRateConverter *this,Bit16s *outBuffer,uint length)

{
  Bit16s BVar1;
  uint local_804c;
  float *ends;
  float *outs;
  float local_8028;
  uint size;
  float floatBuffer [8192];
  uint local_1c;
  Bit16s *pBStack_18;
  uint length_local;
  Bit16s *outBuffer_local;
  SampleRateConverter *this_local;
  
  local_1c = length;
  pBStack_18 = outBuffer;
  if ((this->useSynthDelegate & 1U) == 0) {
    for (; local_1c != 0; local_1c = local_1c - local_804c) {
      if (local_1c < 0x1001) {
        local_804c = local_1c;
      }
      else {
        local_804c = 0x1000;
      }
      getOutputSamples(this,&local_8028,local_804c);
      ends = &local_8028;
      while (ends < &local_8028 + (local_804c << 1)) {
        BVar1 = Synth::convertSample(*ends);
        *pBStack_18 = BVar1;
        ends = ends + 1;
        pBStack_18 = pBStack_18 + 1;
      }
    }
  }
  else {
    Synth::render((Synth *)this->srcDelegate,outBuffer,length);
  }
  return;
}

Assistant:

void SampleRateConverter::getOutputSamples(Bit16s *outBuffer, unsigned int length) {
	static const unsigned int CHANNEL_COUNT = 2;

	if (useSynthDelegate) {
		static_cast<Synth *>(srcDelegate)->render(outBuffer, length);
		return;
	}

	float floatBuffer[CHANNEL_COUNT * MAX_SAMPLES_PER_RUN];
	while (length > 0) {
		const unsigned int size = MAX_SAMPLES_PER_RUN < length ? MAX_SAMPLES_PER_RUN : length;
		getOutputSamples(floatBuffer, size);
		float *outs = floatBuffer;
		float *ends = floatBuffer + CHANNEL_COUNT * size;
		while (outs < ends) {
			*(outBuffer++) = Synth::convertSample(*(outs++));
		}
		length -= size;
	}
}